

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::
SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>_>,_false>
::grow(SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>_>,_false>
       *this,size_t MinSize)

{
  move_iterator<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>_>_*>
  __first;
  move_iterator<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>_>_*>
  __last;
  undefined1 *__ptr;
  InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>_>
  *__result;
  ulong uVar1;
  
  __first._M_current =
       (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>_>
        *)(this->
          super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>_>,_void>
          ).super_SmallVectorBase.BeginX;
  __last._M_current =
       (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>_>
        *)(this->
          super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>_>,_void>
          ).super_SmallVectorBase.EndX;
  uVar1 = ((long)(this->
                 super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>_>,_void>
                 ).super_SmallVectorBase.CapacityX - (long)__first._M_current >> 5) *
          0x2fdeb2fdeb2fdeb3 + 2;
  uVar1 = uVar1 >> 1 | uVar1;
  uVar1 = uVar1 >> 2 | uVar1;
  uVar1 = uVar1 >> 4 | uVar1;
  uVar1 = uVar1 >> 8 | uVar1;
  uVar1 = uVar1 >> 0x10 | uVar1;
  uVar1 = (uVar1 >> 0x20 | uVar1) + 1;
  if (uVar1 <= MinSize) {
    uVar1 = MinSize;
  }
  __result = (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>_>
              *)malloc(uVar1 * 0xf60);
  std::__uninitialized_copy<false>::
  __uninit_copy<std::move_iterator<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<79u,Fixpp::Type::String>,Fixpp::TagT<366u,Fixpp::Type::Float>,Fixpp::Required<Fixpp::TagT<80u,Fixpp::Type::Float>>,Fixpp::TagT<81u,Fixpp::Type::Char>,Fixpp::TagT<92u,Fixpp::Type::String>,Fixpp::TagT<208u,Fixpp::Type::Boolean>,Fixpp::TagT<209u,Fixpp::Type::Int>,Fixpp::TagT<161u,Fixpp::Type::String>,Fixpp::TagT<360u,Fixpp::Type::Int>,Fixpp::TagT<361u,Fixpp::Type::Data>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<12u,Fixpp::Type::Float>,Fixpp::TagT<13u,Fixpp::Type::Char>,Fixpp::TagT<153u,Fixpp::Type::Float>,Fixpp::TagT<154u,Fixpp::Type::Float>,Fixpp::TagT<119u,Fixpp::Type::Float>,Fixpp::TagT<120u,Fixpp::Type::String>,Fixpp::TagT<155u,Fixpp::Type::Float>,Fixpp::TagT<156u,Fixpp::Type::Char>,Fixpp::TagT<159u,Fixpp::Type::Float>,Fixpp::TagT<160u,Fixpp::Type::Char>,Fixpp::SmallRepeatingGroup<Fixpp::Tag___u,Fixpp::Type::Float>,Fixpp::TagT<138u,Fixpp::Type::String>,Fixpp::TagT<139u,Fixpp::Type::Char>>>>*>
            (__first,__last,__result);
  destroy_range((InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>_>
                 *)(this->
                   super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>_>,_void>
                   ).super_SmallVectorBase.BeginX,
                (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>_>
                 *)(this->
                   super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>_>,_void>
                   ).super_SmallVectorBase.EndX);
  __ptr = (undefined1 *)
          (this->
          super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>_>,_void>
          ).super_SmallVectorBase.BeginX;
  if ((U *)__ptr !=
      &(this->
       super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>_>,_void>
       ).FirstEl) {
    free(__ptr);
  }
  (this->
  super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>_>,_void>
  ).super_SmallVectorBase.EndX =
       (void *)(((long)__last._M_current - (long)__first._M_current) + (long)__result);
  (this->
  super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>_>,_void>
  ).super_SmallVectorBase.BeginX = __result;
  (this->
  super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>_>,_void>
  ).super_SmallVectorBase.CapacityX = __result + uVar1;
  return;
}

Assistant:

void SmallVectorTemplateBase<T, isPodLike>::grow(size_t MinSize) {
  size_t CurCapacity = this->capacity();
  size_t CurSize = this->size();
  // Always grow, even from zero.
  size_t NewCapacity = size_t(NextPowerOf2(CurCapacity+2));
  if (NewCapacity < MinSize)
    NewCapacity = MinSize;
  T *NewElts = static_cast<T*>(malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->setEnd(NewElts+CurSize);
  this->BeginX = NewElts;
  this->CapacityX = this->begin()+NewCapacity;
}